

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m6502.h
# Opt level: O3

uint8_t __thiscall m6502::IZY(m6502 *this)

{
  ushort uVar1;
  uint uVar2;
  ssize_t sVar3;
  ssize_t sVar4;
  size_t in_RCX;
  uint uVar5;
  
  uVar1 = this->pc;
  this->pc = uVar1 + 1;
  sVar3 = read(this,(uint)uVar1,(void *)0x0,in_RCX);
  sVar4 = read(this,(uint)sVar3 & 0xff,(void *)0x0,in_RCX);
  sVar3 = read(this,(uint)(byte)((char)sVar3 + 1),(void *)0x0,in_RCX);
  uVar2 = ((uint)sVar3 & 0xff) * 0x100;
  uVar5 = (uint)this->y + ((uint)sVar4 & 0xff | uVar2);
  this->addrAbs = (uint16_t)uVar5;
  return (uVar5 & 0xff00) != uVar2;
}

Assistant:

uint8_t IZY()
  {
    uint16_t t = read(pc++);
    uint16_t lo = read(t & 0x00FFu);
    uint16_t hi = read((t + 1) & 0x00FFu);
    addrAbs = ((hi << 8) | lo) + y;
    if ((addrAbs & 0xFF00u) != (hi << 8))
    {
      return 1;
    }
    return 0;
  }